

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForwardEuler.cpp
# Opt level: O1

void __thiscall
iDynTree::optimalcontrol::integrators::ForwardEuler::~ForwardEuler(ForwardEuler *this)

{
  ~ForwardEuler(this);
  operator_delete(this,0x2d0);
  return;
}

Assistant:

ForwardEuler::~ForwardEuler() {}